

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O0

vec2 __thiscall CTextRender::CaretPosition(CTextRender *this,CTextCursor *pCursor,int NumChars)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  IGraphics *pIVar5;
  CScaledGlyph *pCVar6;
  uint in_EDX;
  float *in_RSI;
  CTextRender *in_RDI;
  long in_FS_OFFSET;
  float fVar7;
  vec2 vVar8;
  CScaledGlyph *pLastScaled;
  float LineOffset;
  int VerticalAlign;
  int HorizontalAlign;
  int GlyphIndex;
  int NumGlyphs;
  int PixelSize;
  float Size;
  int ScreenHeight;
  int ScreenWidth;
  vec2 Offset;
  float LineWidth;
  vec2 ScreenScale;
  float ScreenY1;
  float ScreenX1;
  float ScreenY0;
  float ScreenX0;
  vector2_base<float> *in_stack_ffffffffffffff48;
  vector2_base<float> *pvVar9;
  vector2_base<float> *in_stack_ffffffffffffff50;
  float local_98;
  vector2_base<float> local_5c;
  vector2_base<float> local_54;
  vector2_base<float> local_4c;
  vector2_base<float> local_44;
  vector2_base<float> local_3c;
  vector2_base<float> local_34;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_2c;
  float local_28;
  float local_24;
  vector2_base<float> local_20;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar5 = Graphics(in_RDI);
  iVar3 = IGraphics::ScreenWidth(pIVar5);
  pIVar5 = Graphics(in_RDI);
  iVar4 = IGraphics::ScreenHeight(pIVar5);
  pIVar5 = Graphics(in_RDI);
  (*(pIVar5->super_IInterface)._vptr_IInterface[6])(pIVar5,&local_c,&local_10,&local_14,&local_18);
  vector2_base<float>::vector2_base
            (&local_20,(float)iVar3 / (local_14 - local_c),(float)iVar4 / (local_18 - local_10));
  fVar7 = (float)(int)(in_RSI[0x12] * local_20.field_1.y) / local_20.field_1.y;
  iVar3 = array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::size
                    ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)(in_RSI + 0xc));
  iVar4 = (*(in_RDI->super_IEngineTextRender).super_ITextRender.super_IInterface._vptr_IInterface
            [0x12])(in_RDI,in_RSI,(ulong)in_EDX,&local_24);
  fVar1 = in_RSI[0x15];
  fVar2 = in_RSI[0x15];
  vector2_base<float>::vector2_base((vector2_base<float> *)&local_2c,0.0,0.0);
  local_98 = 0.0;
  if (((uint)fVar1 & 3) == 2) {
    local_2c.x = *in_RSI ^ 0x80000000;
    local_98 = *in_RSI - local_24;
  }
  else if (((uint)fVar1 & 3) == 1) {
    local_2c.x = -*in_RSI / 2.0;
    local_98 = (*in_RSI - local_24) / 2.0;
  }
  if (((uint)fVar2 & 0xc) == 8) {
    local_28 = fVar7 * 1.35 + -in_RSI[1];
  }
  else if (((uint)fVar2 & 0xc) == 4) {
    local_28 = fVar7 * 0.675 + -in_RSI[1] / 2.0;
  }
  if ((iVar4 == 0) || (iVar3 == 0)) {
    local_5c = vector2_base<float>::operator+(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  else if (iVar4 < iVar3) {
    pvVar9 = (vector2_base<float> *)(in_RSI + 6);
    array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::operator[]
              ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)(in_RSI + 0xc),iVar4);
    local_34 = vector2_base<float>::operator+(pvVar9,in_stack_ffffffffffffff48);
    local_5c = vector2_base<float>::operator+(pvVar9,in_stack_ffffffffffffff48);
  }
  else {
    pCVar6 = array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::operator[]
                       ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)(in_RSI + 0xc),
                        iVar3 + -1);
    local_44 = vector2_base<float>::operator+(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_3c = vector2_base<float>::operator+(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    pvVar9 = &local_54;
    vector2_base<float>::vector2_base(pvVar9,pCVar6->m_pGlyph->m_AdvanceX + local_98,0.0);
    local_4c = vector2_base<float>::operator*
                         (in_stack_ffffffffffffff50,(float)((ulong)pvVar9 >> 0x20));
    local_5c = vector2_base<float>::operator+(in_stack_ffffffffffffff50,pvVar9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  vVar8.field_0 = local_5c.field_0;
  vVar8.field_1 = local_5c.field_1;
  return vVar8;
}

Assistant:

vec2 CTextRender::CaretPosition(CTextCursor *pCursor, int NumChars)
{
	float ScreenX0, ScreenY0, ScreenX1, ScreenY1;
	int ScreenWidth = Graphics()->ScreenWidth();
	int ScreenHeight = Graphics()->ScreenHeight();
	Graphics()->GetScreen(&ScreenX0, &ScreenY0, &ScreenX1, &ScreenY1);

	vec2 ScreenScale = vec2(ScreenWidth/(ScreenX1-ScreenX0), ScreenHeight/(ScreenY1-ScreenY0));
	float Size = pCursor->m_FontSize;
	int PixelSize = (int)(Size * ScreenScale.y);
	Size = PixelSize / ScreenScale.y;

	int NumGlyphs = pCursor->m_Glyphs.size();
	float LineWidth;
	int GlyphIndex = CharToGlyph(pCursor, NumChars, &LineWidth);

	int HorizontalAlign = pCursor->m_Align & TEXTALIGN_MASK_HORI;
	int VerticalAlign = pCursor->m_Align & TEXTALIGN_MASK_VERT;

	vec2 Offset = vec2(0,0);
	float LineOffset = 0.0f;

	if(HorizontalAlign == TEXTALIGN_RIGHT)
	{
		Offset.x = -pCursor->m_Width;
		LineOffset = pCursor->m_Width - LineWidth;
	}
	else if(HorizontalAlign == TEXTALIGN_CENTER)
	{
		Offset.x = -pCursor->m_Width / 2.0f;
		LineOffset = (pCursor->m_Width - LineWidth) / 2.0f;
	}

	if(VerticalAlign == TEXTALIGN_BOTTOM)
		Offset.y = -pCursor->m_Height + Size * 1.35f;
	else if(VerticalAlign == TEXTALIGN_MIDDLE)
		Offset.y = -pCursor->m_Height / 2.0f + Size * 0.675f;

	if(GlyphIndex == 0 || NumGlyphs == 0)
		return pCursor->m_CursorPos + Offset;

	if(GlyphIndex < NumGlyphs)
		return pCursor->m_CursorPos + pCursor->m_Glyphs[GlyphIndex].m_Advance + Offset;

	CScaledGlyph *pLastScaled = &pCursor->m_Glyphs[NumGlyphs-1];
	return pCursor->m_CursorPos + pLastScaled->m_Advance + Offset
		+ vec2(pLastScaled->m_pGlyph->m_AdvanceX + LineOffset, 0) * pLastScaled->m_Size;
}